

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::GLSL420Pack::TestBase::iterate(TestBase *this)

{
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *pTVar4;
  bool test_result;
  Functions *gl;
  TestBase *this_local;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  bVar1 = Utils::isExtensionSupported
                    ((this->super_TestCase).m_context,"GL_ARB_explicit_uniform_location");
  this->m_is_explicit_uniform_location = bVar1;
  bVar1 = Utils::isExtensionSupported
                    ((this->super_TestCase).m_context,"GL_ARB_shading_language_420pack");
  this->m_is_shader_language_420pack = bVar1;
  bVar1 = Utils::isGLVersionAtLeast((Functions *)CONCAT44(extraout_var,iVar2),4,3);
  this->m_is_compute_shader_supported = bVar1;
  bVar1 = test(this);
  if (bVar1) {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    tcu::TestContext::setTestResult(pTVar4,QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    tcu::TestContext::setTestResult(pTVar4,QP_TEST_RESULT_FAIL,"Fail");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TestBase::iterate()
{
	/* GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Check extension support and version */
	m_is_explicit_uniform_location = Utils::isExtensionSupported(m_context, "GL_ARB_explicit_uniform_location");
	m_is_shader_language_420pack   = Utils::isExtensionSupported(m_context, "GL_ARB_shading_language_420pack");
	m_is_compute_shader_supported  = Utils::isGLVersionAtLeast(gl, 4, 3);

	/* Execute test */
	bool test_result = test();

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}